

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O3

BigInt * multiplicative_inverse(BigInt *__return_storage_ptr__,BigInt *e,BigInt *phi)

{
  bool bVar1;
  bool bVar2;
  BigInt g;
  BigInt x;
  BigInt y;
  BigInt local_98;
  BigInt local_78;
  BigInt local_58;
  BigInt local_38;
  
  local_58.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.sign = 1;
  local_38.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.sign = 1;
  extended_gcd(&local_78,e,phi,&local_58,&local_38);
  BigInt::BigInt(&local_98,1);
  bVar1 = BigInt::operator<(&local_78,&local_98);
  bVar2 = true;
  if (!bVar1) {
    bVar2 = BigInt::operator<(&local_98,&local_78);
  }
  if (local_98.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (bVar2 == false) {
    BigInt::operator+(&local_98,&local_58,phi);
    BigInt::operator%(__return_storage_ptr__,&local_98,phi);
    if (local_98.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.vector_value.
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    BigInt::BigInt(__return_storage_ptr__,0);
  }
  if (local_78.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt multiplicative_inverse(const BigInt &e, const BigInt &phi) {
    BigInt x, y;
    BigInt g = extended_gcd(e, phi, x, y);
    if (g != BigInt(1))
        return BigInt(0);
    //throw invalid_argument("phi and public key pair have no multiplicative inverse");

    return (x + phi) % phi; //! for optimization and negatives
}